

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O3

QList<QByteArray> * __thiscall
QMap<QNetworkRequest::KnownHeaders,_QList<QByteArray>_>::operator[]
          (QMap<QNetworkRequest::KnownHeaders,_QList<QByteArray>_> *this,KnownHeaders *key)

{
  _Rb_tree_header *p_Var1;
  KnownHeaders KVar2;
  QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>
  *pQVar3;
  _Rb_tree_iterator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_> _Var4;
  _Base_ptr p_Var5;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>,_bool>
  pVar6;
  QArrayDataPointer<QByteArray> local_60;
  pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_> local_48;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_28.d.ptr ==
       (QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>
           *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_28.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>_*>
          )(QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>
       *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>
                        *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  pQVar3 = (this->d).d.ptr;
  p_Var5 = *(_Base_ptr *)((long)&(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  KVar2 = *key;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header;
    _Var4._M_node = &p_Var1->_M_header;
    do {
      if ((int)KVar2 <= (int)p_Var5[1]._M_color) {
        _Var4._M_node = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < (int)KVar2];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)_Var4._M_node != p_Var1) &&
       ((int)_Var4._M_node[1]._M_color <= (int)KVar2)) goto LAB_0019e73a;
  }
  local_60.d = (Data *)0x0;
  local_48.second.d.d = (Data *)0x0;
  local_60.ptr = (QByteArray *)0x0;
  local_60.size = 0;
  local_48.second.d.ptr = (QByteArray *)0x0;
  local_48.second.d.size = 0;
  local_48.first = KVar2;
  pVar6 = std::
          _Rb_tree<QNetworkRequest::KnownHeaders,std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>,std::_Select1st<std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>>,std::less<QNetworkRequest::KnownHeaders>,std::allocator<std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>>>
          ::_M_insert_unique<std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>>
                    ((_Rb_tree<QNetworkRequest::KnownHeaders,std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>,std::_Select1st<std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>>,std::less<QNetworkRequest::KnownHeaders>,std::allocator<std::pair<QNetworkRequest::KnownHeaders_const,QList<QByteArray>>>>
                      *)&pQVar3->m,&local_48);
  _Var4 = pVar6.first._M_node;
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_48.second.d);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_60);
LAB_0019e73a:
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QNetworkRequest::KnownHeaders,_QList<QByteArray>,_std::less<QNetworkRequest::KnownHeaders>,_std::allocator<std::pair<const_QNetworkRequest::KnownHeaders,_QList<QByteArray>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QList<QByteArray> *)&_Var4._M_node[1]._M_parent;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }